

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edithdu.c
# Opt level: O0

int ffcpdt(fitsfile *infptr,fitsfile *outfptr,int *status)

{
  undefined1 local_b98 [8];
  char buffer [2880];
  long local_50;
  LONGLONG outdatastart;
  LONGLONG indataend;
  LONGLONG indatastart;
  long ii;
  long nb;
  int *status_local;
  fitsfile *outfptr_local;
  fitsfile *infptr_local;
  
  if (*status < 1) {
    if (infptr == outfptr) {
      *status = 0x65;
      infptr_local._4_4_ = 0x65;
    }
    else {
      nb = (long)status;
      status_local = &outfptr->HDUposition;
      outfptr_local = infptr;
      ffghadll(infptr,(LONGLONG *)0x0,&indataend,&outdatastart,status);
      ffghadll((fitsfile *)status_local,(LONGLONG *)0x0,&local_50,(LONGLONG *)0x0,(int *)nb);
      ii = (outdatastart - indataend) / 0xb40;
      if (0 < ii) {
        if (outfptr_local->Fptr == *(FITSfile **)(status_local + 2)) {
          for (indatastart = 0; indatastart < ii; indatastart = indatastart + 1) {
            ffmbyt(outfptr_local,indataend,0,(int *)nb);
            ffgbyt(outfptr_local,0xb40,local_b98,(int *)nb);
            ffmbyt((fitsfile *)status_local,local_50,1,(int *)nb);
            ffpbyt((fitsfile *)status_local,0xb40,local_b98,(int *)nb);
            indataend = indataend + 0xb40;
            local_50 = local_50 + 0xb40;
          }
        }
        else {
          ffmbyt(outfptr_local,indataend,0,(int *)nb);
          ffmbyt((fitsfile *)status_local,local_50,1,(int *)nb);
          for (indatastart = 0; indatastart < ii; indatastart = indatastart + 1) {
            ffgbyt(outfptr_local,0xb40,local_b98,(int *)nb);
            ffpbyt((fitsfile *)status_local,0xb40,local_b98,(int *)nb);
          }
        }
      }
      infptr_local._4_4_ = *(int *)nb;
    }
  }
  else {
    infptr_local._4_4_ = *status;
  }
  return infptr_local._4_4_;
}

Assistant:

int ffcpdt(fitsfile *infptr,    /* I - FITS file pointer to input file  */
           fitsfile *outfptr,   /* I - FITS file pointer to output file */
           int *status)         /* IO - error status     */
{
/*
  copy the data unit from the CHDU of infptr to the CHDU of outfptr. 
  This will overwrite any data already in the outfptr CHDU.
*/
    long nb, ii;
    LONGLONG indatastart, indataend, outdatastart;
    char buffer[2880];

    if (*status > 0)
        return(*status);

    if (infptr == outfptr)
        return(*status = SAME_FILE);

    ffghadll(infptr,  NULL, &indatastart, &indataend, status);
    ffghadll(outfptr, NULL, &outdatastart, NULL, status);

    /* Calculate the number of blocks to be copied  */
    nb = (long) ((indataend - indatastart) / 2880);

    if (nb > 0)
    {
      if (infptr->Fptr == outfptr->Fptr)
      {
        /* copying between 2 HDUs in the SAME file */
        for (ii = 0; ii < nb; ii++)
        {
            ffmbyt(infptr,  indatastart,  REPORT_EOF, status);
            ffgbyt(infptr,  2880L, buffer, status); /* read input block */

            ffmbyt(outfptr, outdatastart, IGNORE_EOF, status);
            ffpbyt(outfptr, 2880L, buffer, status); /* write output block */

            indatastart  += 2880; /* move address */
            outdatastart += 2880; /* move address */
        }
      }
      else
      {
        /* copying between HDUs in separate files */
        /* move to the initial copy position in each of the files */
        ffmbyt(infptr,  indatastart,  REPORT_EOF, status);
        ffmbyt(outfptr, outdatastart, IGNORE_EOF, status);

        for (ii = 0; ii < nb; ii++)
        {
            ffgbyt(infptr,  2880L, buffer, status); /* read input block */
            ffpbyt(outfptr, 2880L, buffer, status); /* write output block */
        }
      }
    }
    return(*status);
}